

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  FileOptions *pFVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)(this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  while (0 < (int)uVar4) {
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    bVar3 = DescriptorProto::IsInitialized
                      ((DescriptorProto *)
                       ((this->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    if (!bVar3) {
      return false;
    }
  }
  uVar4 = (ulong)(uint)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  while (0 < (int)uVar4) {
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    bVar3 = EnumDescriptorProto::IsInitialized
                      ((EnumDescriptorProto *)
                       ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    if (!bVar3) {
      return false;
    }
  }
  uVar4 = (ulong)(uint)(this->service_).super_RepeatedPtrFieldBase.current_size_;
  while (0 < (int)uVar4) {
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    bVar3 = ServiceDescriptorProto::IsInitialized
                      ((ServiceDescriptorProto *)
                       ((this->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    if (!bVar3) {
      return false;
    }
  }
  uVar4 = (ulong)(uint)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
  while (0 < (int)uVar4) {
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    bVar3 = FieldDescriptorProto::IsInitialized
                      ((FieldDescriptorProto *)
                       ((this->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    if (!bVar3) {
      return false;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 8) != 0) {
    pFVar1 = this->options_;
    bVar3 = internal::ExtensionSet::IsInitialized(&pFVar1->_extensions_);
    if (!bVar3) {
      return false;
    }
    bVar3 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                      (&pFVar1->uninterpreted_option_);
    if (!bVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->message_type())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->service())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->extension())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}